

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::advanceForwards
          (QSequentialAnimationGroupPrivate *this,AnimationIndex *newAnimationIndex)

{
  parameter_type pVar1;
  int iVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  int *in_RSI;
  QSequentialAnimationGroupPrivate *in_RDI;
  int in_stack_0000000c;
  QAbstractAnimation *anim_1;
  int i_1;
  QAbstractAnimation *anim;
  int i;
  QAbstractAnimation *in_stack_ffffffffffffffa8;
  QList<QAbstractAnimation_*> *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar5 = in_RDI->lastLoop;
  pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x68a2c2);
  if (iVar5 < pVar1) {
    in_stack_ffffffffffffffec = in_RDI->currentAnimationIndex;
    while( true ) {
      in_stack_ffffffffffffffb8 = (long)in_stack_ffffffffffffffec;
      qVar3 = QList<QAbstractAnimation_*>::size(&(in_RDI->super_QAnimationGroupPrivate).animations);
      if (qVar3 <= in_stack_ffffffffffffffb8) break;
      ppQVar4 = QList<QAbstractAnimation_*>::at
                          (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
      iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      in_stack_ffffffffffffffb0 = (QList<QAbstractAnimation_*> *)*ppQVar4;
      setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                          CONCAT44(iVar5,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffdc,
                          SUB81((ulong)in_RDI >> 0x38,0));
      animationActualTotalDuration(in_RDI,iVar2);
      QAbstractAnimation::setCurrentTime
                ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                 ,in_stack_0000000c);
      in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1;
    }
    qVar3 = QList<QAbstractAnimation_*>::size(&(in_RDI->super_QAnimationGroupPrivate).animations);
    if (qVar3 == 1) {
      activateCurrentAnimation(in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    }
    else {
      setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                          CONCAT44(iVar5,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffdc,
                          SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  for (iVar2 = in_RDI->currentAnimationIndex; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
    ppQVar4 = QList<QAbstractAnimation_*>::at
                        (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = *ppQVar4;
    setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                        CONCAT44(iVar5,in_stack_ffffffffffffffc8),iVar2,
                        SUB81((ulong)in_RDI >> 0x38,0));
    animationActualTotalDuration(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    QAbstractAnimation::setCurrentTime
              ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_0000000c);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::advanceForwards(const AnimationIndex &newAnimationIndex)
{
    if (lastLoop < currentLoop) {
        // we need to fast forward to the end
        for (int i = currentAnimationIndex; i < animations.size(); ++i) {
            QAbstractAnimation *anim = animations.at(i);
            setCurrentAnimation(i, true);
            anim->setCurrentTime(animationActualTotalDuration(i));
        }
        // this will make sure the current animation is reset to the beginning
        if (animations.size() == 1)
            // we need to force activation because setCurrentAnimation will have no effect
            activateCurrentAnimation();
        else
            setCurrentAnimation(0, true);
    }

    // and now we need to fast forward from the current position to
    for (int i = currentAnimationIndex; i < newAnimationIndex.index; ++i) {     //### WRONG,
        QAbstractAnimation *anim = animations.at(i);
        setCurrentAnimation(i, true);
        anim->setCurrentTime(animationActualTotalDuration(i));
    }
    // setting the new current animation will happen later
}